

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQBool sq_release(HSQUIRRELVM v,HSQOBJECT *po)

{
  SQBool SVar1;
  
  if ((po->_type & 0x8000000) == 0) {
    return 1;
  }
  SVar1 = RefTable::Release(&v->_sharedstate->_refs_table,po);
  return SVar1;
}

Assistant:

SQBool sq_release(HSQUIRRELVM v,HSQOBJECT *po)
{
    if(!ISREFCOUNTED(type(*po))) return SQTrue;
#ifdef NO_GARBAGE_COLLECTOR
    bool ret = (po->_unVal.pRefCounted->_uiRef <= 1) ? SQTrue : SQFalse;
    __Release(po->_type,po->_unVal);
    return ret; //the ret val doesn't work(and cannot be fixed)
#else
    return _ss(v)->_refs_table.Release(*po);
#endif
}